

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QCommonArrayOps<QModelIndex>::growAppend
          (QCommonArrayOps<QModelIndex> *this,QModelIndex *b,QModelIndex *e)

{
  QModelIndex *pQVar1;
  QModelIndex *pQVar2;
  quintptr qVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  QModelIndex *pQVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<QModelIndex> local_48;
  QModelIndex *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = b;
  if (b != e) {
    lVar6 = (long)e - (long)b;
    lVar5 = (lVar6 >> 3) * -0x5555555555555555;
    local_48.d = (Data *)0x0;
    local_48.ptr = (QModelIndex *)0x0;
    local_48.size = 0;
    pQVar2 = (this->super_Type).super_QGenericArrayOps<QModelIndex>.
             super_QArrayDataPointer<QModelIndex>.ptr;
    if ((b < pQVar2) ||
       (pQVar2 + (this->super_Type).super_QGenericArrayOps<QModelIndex>.
                 super_QArrayDataPointer<QModelIndex>.size <= b)) {
      QArrayDataPointer<QModelIndex>::detachAndGrow
                ((QArrayDataPointer<QModelIndex> *)this,GrowsAtEnd,lVar5,(QModelIndex **)0x0,
                 (QArrayDataPointer<QModelIndex> *)0x0);
    }
    else {
      QArrayDataPointer<QModelIndex>::detachAndGrow
                ((QArrayDataPointer<QModelIndex> *)this,GrowsAtEnd,lVar5,&local_28,&local_48);
      b = local_28;
    }
    if (0 < lVar6) {
      pQVar7 = (QModelIndex *)(lVar6 + (long)b);
      pQVar2 = (this->super_Type).super_QGenericArrayOps<QModelIndex>.
               super_QArrayDataPointer<QModelIndex>.ptr;
      lVar5 = (this->super_Type).super_QGenericArrayOps<QModelIndex>.
              super_QArrayDataPointer<QModelIndex>.size;
      do {
        pQVar2[lVar5].m.ptr = (b->m).ptr;
        iVar4 = b->c;
        qVar3 = b->i;
        pQVar1 = pQVar2 + lVar5;
        pQVar1->r = b->r;
        pQVar1->c = iVar4;
        pQVar1->i = qVar3;
        b = b + 1;
        lVar5 = (this->super_Type).super_QGenericArrayOps<QModelIndex>.
                super_QArrayDataPointer<QModelIndex>.size + 1;
        (this->super_Type).super_QGenericArrayOps<QModelIndex>.super_QArrayDataPointer<QModelIndex>.
        size = lVar5;
      } while (b < pQVar7);
    }
    if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d)->super_QArrayData,0x18,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }